

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O1

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper>::SetName
          (GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper> *this,GLchar *Name)

{
  size_t sVar1;
  char (*in_RCX) [16];
  GLint GVar2;
  string msg;
  string local_38;
  
  if (Name == (GLchar *)0x0) {
    Diligent::FormatString<char[26],char[16]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x33d420,in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x7e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((__glewObjectLabel != (PFNGLOBJECTLABELPROC)0x0) && (this->m_uiHandle != 0)) {
    if (SetName::MaxLabelLen == 0) {
      glGetIntegerv(0x82e8,&SetName::MaxLabelLen);
      glGetError();
      if (SetName::MaxLabelLen < 1) {
        SetName::MaxLabelLen = 0x100;
      }
      SetName::MaxLabelLen = SetName::MaxLabelLen + -1;
    }
    sVar1 = strlen(Name);
    GVar2 = SetName::MaxLabelLen;
    if ((int)sVar1 <= SetName::MaxLabelLen) {
      GVar2 = (int)sVar1;
    }
    (*__glewObjectLabel)(GLQueryCreateReleaseHelper::Type,this->m_uiHandle,GVar2,Name);
    glGetError();
  }
  return;
}

Assistant:

void SetName(const GLchar* Name)
    {
#if GL_KHR_debug
        VERIFY_EXPR(Name != nullptr);
        if (glObjectLabel && m_uiHandle)
        {
            static GLint MaxLabelLen = 0;
            if (MaxLabelLen == 0)
            {
                glGetIntegerv(GL_MAX_LABEL_LENGTH, &MaxLabelLen);
#    ifdef DILIGENT_DEVELOPMENT
                glGetError(); // Ignore GL error
#    endif
                if (MaxLabelLen <= 0)
                {
                    // Minimum required value by the spec
                    MaxLabelLen = 256;
                }

                // The spec requires that the number of characters in <label>,
                // excluding the null terminator, is less than the value of MAX_LABEL_LENGTH.
                // In other words, the maximum length of the label is one less than the value of MAX_LABEL_LENGTH.
                --MaxLabelLen;
            }
            GLsizei Length = static_cast<GLsizei>(strlen(Name));
            if (Length > MaxLabelLen)
                Length = MaxLabelLen;

            glObjectLabel(m_CreateReleaseHelper.Type, m_uiHandle, Length, Name);
#    ifdef DILIGENT_DEVELOPMENT
            glGetError(); // Ignore GL error
#    endif
        }
#endif
    }